

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O2

void recff_buffer_method_skip(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  TRef TVar2;
  TRef TVar3;
  IRRef1 IVar4;
  
  TVar1 = recff_sbufx_check(J,rd,0);
  IVar4 = (IRRef1)TVar1;
  (J->fold).ins.field_0.op1 = IVar4;
  *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45090015;
  TVar1 = lj_opt_fold(J);
  (J->fold).ins.field_0.op1 = IVar4;
  *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45090010;
  TVar2 = lj_opt_fold(J);
  (J->fold).ins.field_0.ot = 0x2a15;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
  TVar2 = lj_opt_fold(J);
  (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
  *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b131275;
  TVar2 = lj_opt_fold(J);
  TVar3 = recff_sbufx_checkint(J,rd,1);
  (J->fold).ins.field_0.ot = 0x3213;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
  TVar2 = lj_opt_fold(J);
  (J->fold).ins.field_0.ot = 0x2909;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
  TVar1 = lj_opt_fold(J);
  (J->fold).ins.field_0.op1 = IVar4;
  *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x3e090015;
  TVar2 = lj_opt_fold(J);
  (J->fold).ins.field_0.ot = 0x4d09;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
  lj_opt_fold(J);
  return;
}

Assistant:

static void LJ_FASTCALL recff_buffer_method_skip(jit_State *J, RecordFFData *rd)
{
  TRef ud = recff_sbufx_check(J, rd, 0);
  TRef trr = recff_sbufx_get_ptr(J, ud, IRFL_SBUF_R);
  TRef trw = recff_sbufx_get_ptr(J, ud, IRFL_SBUF_W);
  TRef len = recff_sbufx_len(J, trr, trw);
  TRef trn = recff_sbufx_checkint(J, rd, 1);
  len = emitir(IRTI(IR_MIN), len, trn);
  trr = emitir(IRT(IR_ADD, IRT_PTR), trr, len);
  recff_sbufx_set_ptr(J, ud, IRFL_SBUF_R, trr);
}